

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void on_mouse(int event,int x,int y,int flags,void *ustc)

{
  int local_68;
  int local_64;
  undefined4 local_60 [2];
  undefined1 *local_58;
  undefined8 local_50;
  Matx<double,_4,_1> local_48;
  
  if (obs_set || event != 1) {
    if (obs_set) {
      orient.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
           = (double)x;
      orient.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
           = (double)y;
      render_flag = true;
      if (event == 1) {
        printf("Now angle: %.4lf\n",(angle * 180.0) / 3.141592653589793);
        return;
      }
    }
  }
  else {
    printf("cv::Point(%d, %d),\n",x,(ulong)(uint)y);
    obs.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         (double)x;
    obs.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
         (double)y;
    local_50 = 0;
    local_60[0] = 0x3010000;
    local_58 = src;
    local_68 = x;
    local_64 = y;
    cv::Matx<double,_4,_1>::Matx(&local_48);
    local_48.val[0] = 0.0;
    local_48.val[1] = 255.0;
    local_48.val[2] = 0.0;
    local_48.val[3] = 0.0;
    cv::circle(local_60,&local_68,3,&local_48,0xffffffffffffffff,8,0);
    obs_set = true;
  }
  return;
}

Assistant:

void on_mouse(int event, int x, int y, int flags, void *ustc) {
    if (event == cv::EVENT_LBUTTONDOWN && obs_set == false) {
        printf("cv::Point(%d, %d),\n", x, y);
        obs(0) = double(x);
        obs(1) = double(y);
        cv::circle(src, cv::Point(x, y), 3, cv::Scalar(0, 255, 0), -1);
        obs_set = true;
    } else if (obs_set == true) {
        orient(0) = double(x);
        orient(1) = double(y);
        render_flag = true;
        if (event == cv::EVENT_LBUTTONDOWN) {
            printf("Now angle: %.4lf\n", angle * 180.0 / M_PI);
        }
    } 
}